

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppbVar1;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  ostream *poVar5;
  istream *piVar6;
  ulong uVar7;
  char *pcVar8;
  size_type sVar9;
  void *pvVar10;
  long lVar11;
  reference program;
  char *local_6d8;
  failure *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688 [32];
  string local_668 [32];
  stringstream local_648 [8];
  stringstream err;
  ostream local_638 [376];
  stringstream local_4c0 [8];
  stringstream out;
  ostream local_4b0 [376];
  reference local_338;
  string *i;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  string *p;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string local_2f0 [4];
  int ntests;
  byte local_2c9;
  ulong uStack_2c8;
  bool first;
  size_t nb;
  int local_2b8;
  int blk;
  int t;
  int last;
  int local_29c;
  string local_298 [4];
  int line;
  string str;
  string local_278 [8];
  string ln;
  undefined1 local_258 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pr;
  ifstream fs;
  char *fname;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc < 2) {
    local_6d8 = "tests.txt";
  }
  else {
    local_6d8 = argv[1];
  }
  ppbVar1 = &pr.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::ifstream::ifstream(ppbVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&in.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_258);
  std::__cxx11::string::string(local_278);
  std::__cxx11::string::string(local_298);
  local_29c = 0;
  std::ifstream::open(ppbVar1,local_6d8,8);
  bVar3 = std::ios::good();
  if ((bVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open the file: ");
    poVar5 = std::operator<<(poVar5,local_6d8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    t = 1;
  }
  else {
    blk = 0;
    while( true ) {
      std::ios::exceptions
                ((int)&pr + 0x10 +
                 (int)*(undefined8 *)
                       (pr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + -0x18));
      local_29c = local_29c + 1;
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)
                          &pr.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_278);
      bVar4 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar4) break;
      uVar2 = *(undefined8 *)
               (pr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + -0x18);
      std::operator|(_S_failbit,_S_badbit);
      std::ios::exceptions((int)&pr + 0x10 + (int)uVar2);
      uVar7 = std::__cxx11::string::size();
      if (1 < uVar7) {
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
        local_2b8 = std::__cxx11::string::find('@',(ulong)(uint)(int)*pcVar8);
        local_2b8 = local_2b8 + 1;
        if (local_2b8 != 0) {
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
          nb._4_4_ = (uint)(*pcVar8 == '[');
          if ((*pcVar8 == '[') ||
             (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278), *pcVar8 == '='))
          {
            if ((2 < local_2b8) &&
               ((sVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&in.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage), sVar9 == 0
                || (sVar9 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_258), sVar9 == 0)))) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Bad test file format at line ");
              pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
              std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
              argv_local._4_4_ = 2;
              t = 1;
              goto LAB_00119373;
            }
            if (nb._4_4_ == 0) {
              std::__cxx11::string::substr((ulong)local_2f0,(ulong)local_278);
              std::__cxx11::string::operator=(local_298,local_2f0);
              std::__cxx11::string::~string(local_2f0);
            }
            else {
              lVar11 = std::__cxx11::string::find_first_not_of((char)local_278,0x5b);
              if (lVar11 != -1) {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Bad test file format at line ");
                pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
                std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = 2;
                t = 1;
                goto LAB_00119373;
              }
              lVar11 = std::__cxx11::string::size();
              uStack_2c8 = lVar11 - 1;
              local_2c9 = 1;
              std::__cxx11::string::clear();
              while( true ) {
                local_29c = local_29c + 1;
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)
                           &pr.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_278);
                uVar7 = std::__cxx11::string::find_first_not_of((char)local_278,0x5d);
                bVar4 = true;
                if (uStack_2c8 <= uVar7) {
                  uVar7 = std::__cxx11::string::size();
                  bVar4 = uVar7 < uStack_2c8;
                }
                if (!bVar4) break;
                if ((local_2c9 & 1) == 0) {
                  std::__cxx11::string::append((char *)local_298);
                }
                else {
                  local_2c9 = 0;
                }
                std::__cxx11::string::append(local_298);
              }
              uVar7 = std::__cxx11::string::size();
              if (uVar7 != uStack_2c8) {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Bad test file format at line ");
                pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
                std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = 2;
                t = 1;
                goto LAB_00119373;
              }
            }
            if (local_2b8 == 1) {
              if (1 < blk) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&in.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&in.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)local_298);
            }
            else if (local_2b8 == 2) {
              if (blk != 2) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_258);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258,(value_type *)local_298);
            }
            else {
              __range5._4_4_ = 0;
              ppbVar1 = &in.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              __end5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)ppbVar1);
              p = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&p), bVar4) {
                program = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end5);
                __end6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_258);
                i = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258);
                while (bVar4 = __gnu_cxx::operator!=
                                         (&__end6,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&i), bVar4) {
                  local_338 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&__end6);
                  __range5._4_4_ = __range5._4_4_ + 1;
                  std::__cxx11::stringstream::stringstream(local_4c0);
                  std::__cxx11::stringstream::stringstream(local_648);
                  interpreter(program,local_338,local_4b0,local_638);
                  if (local_2b8 == 3) {
                    std::__cxx11::stringstream::str();
                    bVar3 = std::__cxx11::string::empty();
                    std::__cxx11::string::~string(local_668);
                    if (((bVar3 ^ 0xff) & 1) == 0) {
                      std::__cxx11::stringstream::str();
                      bVar4 = std::operator!=(local_688,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_298);
                      std::__cxx11::string::~string((string *)local_688);
                      if (!bVar4) goto LAB_00119143;
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
                      poVar5 = std::operator<<(poVar5,"incorrect output");
                      poVar5 = std::operator<<(poVar5," on test #");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range5._4_4_);
                      poVar5 = std::operator<<(poVar5," at line ");
                      pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
                      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                      argv_local._4_4_ = 3;
                      t = 1;
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
                      poVar5 = std::operator<<(poVar5,"non-empty error output");
                      poVar5 = std::operator<<(poVar5," on test #");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range5._4_4_);
                      poVar5 = std::operator<<(poVar5," at line ");
                      pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
                      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                      argv_local._4_4_ = 3;
                      t = 1;
                    }
                  }
                  else {
                    std::__cxx11::stringstream::str();
                    std::__cxx11::string::size();
                    std::__cxx11::string::substr((ulong)local_6a8,(ulong)&x);
                    bVar4 = std::operator!=(local_6a8,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_298);
                    std::__cxx11::string::~string((string *)local_6a8);
                    std::__cxx11::string::~string((string *)&x);
                    if (bVar4) {
                      poVar5 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
                      poVar5 = std::operator<<(poVar5,"incorrect error output");
                      poVar5 = std::operator<<(poVar5," on test #");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range5._4_4_);
                      poVar5 = std::operator<<(poVar5," at line ");
                      pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
                      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                      argv_local._4_4_ = 3;
                      t = 1;
                    }
                    else {
LAB_00119143:
                      t = 0;
                    }
                  }
                  std::__cxx11::stringstream::~stringstream(local_648);
                  std::__cxx11::stringstream::~stringstream(local_4c0);
                  if (t != 0) goto LAB_00119373;
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&__end6);
                }
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end5);
              }
              poVar5 = std::operator<<((ostream *)&std::cout,"Passed ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range5._4_4_);
              poVar5 = std::operator<<(poVar5," test(s) on line ");
              pvVar10 = (void *)std::ostream::operator<<(poVar5,local_29c);
              std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            }
            blk = local_2b8;
          }
        }
      }
    }
    std::operator<<((ostream *)&std::cout,"All tests succeeded\n");
    argv_local._4_4_ = 0;
    t = 1;
  }
LAB_00119373:
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream
            (&pr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    const char* fname = argc > 1 ? argv[1] : "tests.txt";

    std::ifstream fs;

    std::vector<std::string> pr, in;
    std::string ln, str;
    int line = 0;
#define READLN (++line, std::getline(fs, ln))
#define FMT_ASSERT(E) if(!(E)) { std::cerr << "Bad test file format at line " << line << std::endl; return 2; }
#define FAIL_TEST(MSG) std::cerr << "Test failed: " << MSG << " on test #" << ntests << " at line " << line <<std::endl; return 3

    try {
        fs.open(fname);
        if (!fs.good()) {
            std::cerr << "Couldn't open the file: " << fname << std::endl;
            return 1;
        }
        int last = 0;
        while (fs.exceptions(std::ifstream::badbit), READLN) {
            fs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
            int t, blk;
            if (ln.size() >= 2 && (t = 1 + TYPES.find(ln[0])) && ((blk = ln[1] == BLOCK_O) || ln[1] == LINE_O)) {
                if (t > 2) FMT_ASSERT(pr.size() && in.size());
                if (blk) {
                    FMT_ASSERT(!~ln.find_first_not_of(BLOCK_O, 2));
                    size_t nb = ln.size() - 1;
                    bool first = true;
                    str.clear();
                    while (READLN, ln.find_first_not_of(BLOCK_C) < nb || ln.size() < nb) {
                        if (first) first = false;
                        else str.append("\n");
                        str.append(ln);
                    }
                    FMT_ASSERT(ln.size() == nb);
                } else str = ln.substr(2);
                if (t == 1) {
                    if (last > 1) pr.clear();
                    pr.push_back(str);
                } else if (t == 2) {
                    if (last != 2) in.clear();
                    in.push_back(str);
                } else {
                    int ntests = 0;
                    for (std::string &p : pr) {
                        for (std::string &i : in) {
                            ++ntests;
                            std::stringstream out, err;
                            interpreter(p, i, out, err);
                            if (t == 3) {
                                if (!err.str().empty()) {
                                    FAIL_TEST("non-empty error output");
                                }
                                if (out.str() != str) {
                                    FAIL_TEST("incorrect output");
                                }
                            } else {
                                if (err.str().substr(0, str.size()) != str) {
                                    FAIL_TEST("incorrect error output");
                                }
                            }
                        }
                    }
                    std::cout << "Passed " << ntests << " test(s) on line " << line << std::endl;
                }
                last = t;
            }
        }

    } catch (const decltype(fs)::failure& x) {
        std::cerr << "Error reading " << fname << " : " << x.what() << std::endl;
        return 1;
    }

    std::cout << "All tests succeeded\n";

    return 0;
}